

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O0

size_t __thiscall asmjit::CodeHolder::relocate(CodeHolder *this,void *_dst,uint64_t baseAddress)

{
  char cVar1;
  long lVar2;
  Logger *this_00;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  size_t sVar7;
  void *in_RDX;
  void *in_RSI;
  long in_RDI;
  float extraout_XMM0_Da;
  float __x;
  uint32_t byte1;
  uint32_t byte0;
  bool useTrampoline;
  size_t codeOffset;
  uint64_t ptr;
  RelocEntry *re;
  size_t i;
  RelocEntry **reArray;
  size_t numRelocs;
  size_t trampOffset;
  size_t maxCodeSize;
  size_t minCodeSize;
  Logger *logger;
  uint8_t *dst;
  SectionEntry *section;
  char *in_stack_000001a0;
  int in_stack_000001ac;
  char *in_stack_000001b0;
  CodeHolder *in_stack_fffffffffffffdb0;
  undefined1 local_234;
  long local_220;
  ulong local_210;
  size_t local_1f8;
  void *local_1c8;
  
  if (*(long *)(in_RDI + 0xe8) == 0) {
    DebugUtils::assertionFailed(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0);
  }
  lVar2 = **(long **)(in_RDI + 0xe0);
  if (lVar2 == 0) {
    DebugUtils::assertionFailed(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0);
  }
  local_1c8 = in_RDX;
  if (in_RDX == (void *)0xffffffffffffffff) {
    local_1c8 = in_RSI;
  }
  this_00 = *(Logger **)(in_RDI + 0x28);
  local_1f8 = *(size_t *)(lVar2 + 0x40);
  sVar7 = getCodeSize(in_stack_fffffffffffffdb0);
  memcpy(in_RSI,*(void **)(lVar2 + 0x38),local_1f8);
  uVar3 = *(ulong *)(in_RDI + 0x118);
  lVar2 = *(long *)(in_RDI + 0x110);
  local_210 = 0;
  __x = extraout_XMM0_Da;
  do {
    if (uVar3 <= local_210) {
      return local_1f8;
    }
    lVar4 = *(long *)(lVar2 + local_210 * 8);
    if (*(char *)(lVar4 + 4) != '\0') {
      local_220 = *(long *)(lVar4 + 0x18);
      uVar5 = *(ulong *)(lVar4 + 0x10);
      if (sVar7 < uVar5 + *(byte *)(lVar4 + 5)) {
        return 0x15;
      }
      bVar6 = false;
      switch(*(undefined1 *)(lVar4 + 4)) {
      case 1:
        break;
      case 2:
        local_220 = (long)local_1c8 + local_220;
        break;
      case 3:
        local_220 = local_220 -
                    ((long)local_1c8 + (ulong)*(byte *)(lVar4 + 5) + *(long *)(lVar4 + 0x10));
        break;
      case 4:
        if (*(char *)(lVar4 + 5) != '\x04') {
          return 0x15;
        }
        local_220 = local_220 -
                    ((long)local_1c8 + (ulong)*(byte *)(lVar4 + 5) + *(long *)(lVar4 + 0x10));
        bVar6 = local_220 < -0x80000000 || 0x7fffffff < local_220;
        if (bVar6) {
          local_220 = (local_1f8 - *(long *)(lVar4 + 0x10)) - (ulong)*(byte *)(lVar4 + 5);
        }
        break;
      default:
        return 0x15;
      }
      cVar1 = *(char *)(lVar4 + 5);
      if (cVar1 == '\x01') {
        *(char *)((long)in_RSI + uVar5) = (char)local_220;
      }
      else if (cVar1 == '\x04') {
        *(int *)((long)in_RSI + uVar5) = (int)local_220;
      }
      else {
        if (cVar1 != '\b') {
          return 0x15;
        }
        *(long *)((long)in_RSI + uVar5) = local_220;
      }
      if (bVar6) {
        cVar1 = *(char *)((long)in_RSI + (uVar5 - 1));
        if (cVar1 == -0x18) {
          local_234 = 0x15;
        }
        else {
          if (cVar1 != -0x17) {
            return 0x15;
          }
          local_234 = 0x25;
        }
        if (uVar5 < 2) {
          DebugUtils::assertionFailed(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0);
        }
        *(undefined1 *)((long)in_RSI + (uVar5 - 2)) = 0xff;
        *(undefined1 *)((long)in_RSI + (uVar5 - 1)) = local_234;
        *(undefined8 *)((long)in_RSI + local_1f8) = *(undefined8 *)(lVar4 + 0x18);
        local_1f8 = local_1f8 + 8;
        if (this_00 != (Logger *)0x0) {
          __x = Logger::logf(this_00,__x);
        }
      }
    }
    local_210 = local_210 + 1;
  } while( true );
}

Assistant:

size_t CodeHolder::relocate(void* _dst, uint64_t baseAddress) const noexcept {
  SectionEntry* section = _sections[0];
  ASMJIT_ASSERT(section != nullptr);

  uint8_t* dst = static_cast<uint8_t*>(_dst);
  if (baseAddress == Globals::kNoBaseAddress)
    baseAddress = static_cast<uint64_t>((uintptr_t)dst);

#if !defined(ASMJIT_DISABLE_LOGGING)
  Logger* logger = getLogger();
#endif // ASMJIT_DISABLE_LOGGING

  size_t minCodeSize = section->getBuffer().getLength(); // Minimum code size.
  size_t maxCodeSize = getCodeSize();                    // Includes all possible trampolines.

  // We will copy the exact size of the generated code. Extra code for trampolines
  // is generated on-the-fly by the relocator (this code doesn't exist at the moment).
  ::memcpy(dst, section->_buffer._data, minCodeSize);

  // Trampoline offset from the beginning of dst/baseAddress.
  size_t trampOffset = minCodeSize;

  // Relocate all recorded locations.
  size_t numRelocs = _relocations.getLength();
  const RelocEntry* const* reArray = _relocations.getData();

  for (size_t i = 0; i < numRelocs; i++) {
    const RelocEntry* re = reArray[i];

    // Possibly deleted or optimized out relocation entry.
    if (re->getType() == RelocEntry::kTypeNone)
      continue;

    uint64_t ptr = re->getData();
    size_t codeOffset = static_cast<size_t>(re->getSourceOffset());

    // Make sure that the `RelocEntry` is correct, we don't want to write
    // out of bounds in `dst`.
    if (ASMJIT_UNLIKELY(codeOffset + re->getSize() > maxCodeSize))
      return DebugUtils::errored(kErrorInvalidRelocEntry);

    // Whether to use trampoline, can be only used if relocation type is `kRelocTrampoline`.
    bool useTrampoline = false;

    switch (re->getType()) {
      case RelocEntry::kTypeAbsToAbs: {
        break;
      }

      case RelocEntry::kTypeRelToAbs: {
        ptr += baseAddress;
        break;
      }

      case RelocEntry::kTypeAbsToRel: {
        ptr -= baseAddress + re->getSourceOffset() + re->getSize();
        break;
      }

      case RelocEntry::kTypeTrampoline: {
        if (re->getSize() != 4)
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        ptr -= baseAddress + re->getSourceOffset() + re->getSize();
        if (!Utils::isInt32(static_cast<int64_t>(ptr))) {
          ptr = (uint64_t)trampOffset - re->getSourceOffset() - re->getSize();
          useTrampoline = true;
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }

    switch (re->getSize()) {
      case 1:
        Utils::writeU8(dst + codeOffset, static_cast<uint32_t>(ptr & 0xFFU));
        break;

      case 4:
        Utils::writeU32u(dst + codeOffset, static_cast<uint32_t>(ptr & 0xFFFFFFFFU));
        break;

      case 8:
        Utils::writeU64u(dst + codeOffset, ptr);
        break;

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }

    // Handle the trampoline case.
    if (useTrampoline) {
      // Bytes that replace [REX, OPCODE] bytes.
      uint32_t byte0 = 0xFF;
      uint32_t byte1 = dst[codeOffset - 1];

      if (byte1 == 0xE8) {
        // Patch CALL/MOD byte to FF/2 (-> 0x15).
        byte1 = x86EncodeMod(0, 2, 5);
      }
      else if (byte1 == 0xE9) {
        // Patch JMP/MOD byte to FF/4 (-> 0x25).
        byte1 = x86EncodeMod(0, 4, 5);
      }
      else {
        return DebugUtils::errored(kErrorInvalidRelocEntry);
      }

      // Patch `jmp/call` instruction.
      ASMJIT_ASSERT(codeOffset >= 2);
      dst[codeOffset - 2] = static_cast<uint8_t>(byte0);
      dst[codeOffset - 1] = static_cast<uint8_t>(byte1);

      // Store absolute address and advance the trampoline pointer.
      Utils::writeU64u(dst + trampOffset, re->getData());
      trampOffset += 8;

#if !defined(ASMJIT_DISABLE_LOGGING)
      if (logger)
        logger->logf("[reloc] dq 0x%016llX ; Trampoline\n", re->getData());
#endif // !ASMJIT_DISABLE_LOGGING
    }
  }

  // If there are no trampolines this is the same as `minCodeSize`.
  return trampOffset;
}